

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ostream * smf::MidiFile::writeLittleEndianLong(ostream *out,long value)

{
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_23,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_24,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_22,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_21,1);
  return out;
}

Assistant:

std::ostream& MidiFile::writeLittleEndianLong(std::ostream& out, long value) {
	union { char bytes[4]; long l; } data;
	data.l = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}